

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkBeamIGAslider::IntLoadConstraint_C
          (ChLinkBeamIGAslider *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<double> splinepoint;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_98;
  ChMatrix33<double> local_60;
  
  iVar5 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (c,recovery_clamp,this,CONCAT44(in_register_00000034,off_L),Qc,
                     CONCAT71(in_register_00000009,do_clamp));
  if ((char)iVar5 != '\0') {
    peVar3 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (peVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
    dVar1 = (peVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    dVar6 = (this->m_csys).rot.m_data[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar6;
    dVar7 = (this->m_csys).rot.m_data[1];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar7;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar7 * dVar1;
    auVar10 = vfmsub231sd_fma(auVar13,auVar8,auVar10);
    dVar7 = (peVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar7;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (this->m_csys).rot.m_data[2];
    auVar10 = vfnmadd231sd_fma(auVar10,auVar14,auVar15);
    dVar2 = (peVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar2;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (this->m_csys).rot.m_data[3];
    auVar13 = vfnmadd231sd_fma(auVar10,auVar16,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar6 * dVar1;
    auVar10 = vfmadd231sd_fma(auVar18,auVar8,auVar12);
    auVar10 = vfnmadd231sd_fma(auVar10,auVar16,auVar15);
    auVar10 = vfmadd231sd_fma(auVar10,auVar14,auVar17);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar6 * dVar7;
    auVar11 = vfmadd231sd_fma(auVar19,auVar8,auVar15);
    auVar11 = vfmadd231sd_fma(auVar11,auVar16,auVar12);
    auVar16 = vfnmadd231sd_fma(auVar11,auVar9,auVar17);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar6 * dVar2;
    auVar11 = vfmadd231sd_fma(auVar11,auVar8,auVar17);
    auVar11 = vfnmadd231sd_fma(auVar11,auVar14,auVar12);
    auVar11 = vfmadd231sd_fma(auVar11,auVar9,auVar15);
    local_98.m_data[0] = auVar13._0_8_;
    local_98.m_data[1] = auVar10._0_8_;
    local_98.m_data[2] = auVar16._0_8_;
    local_98.m_data[3] = auVar11._0_8_;
    ChMatrix33<double>::ChMatrix33(&local_60,&local_98);
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    dVar6 = ChElementBeamIGA::GetU1
                      ((this->m_beams).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[this->active_element].
                       super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    dVar7 = ChElementBeamIGA::GetU2
                      ((this->m_beams).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[this->active_element].
                       super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    dVar1 = this->tau - dVar6;
    peVar4 = (this->m_beams).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->active_element].
             super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)(*(long *)&peVar4->super_ChElementBeam + 0xe8))
              ((dVar1 + dVar1) / (dVar7 - dVar6) + -1.0,peVar4,&local_98);
    peVar3 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ChTransform<double>::TransformLocalToParent
              (&(this->m_csys).pos,
               &(peVar3->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(peVar3->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  }
  return;
}

Assistant:

void ChLinkBeamIGAslider::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                              ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                              const double c,            // a scaling factor
                                              bool do_clamp,             // apply clamping to c*C?
                                              double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());

    ChVector<> splinepoint;
    double u1 = m_beams[this->active_element]->GetU1();
    double u2 = m_beams[this->active_element]->GetU2();
    double eta = (2.0 * (this->tau - u1) / (u2 - u1)) - 1.0;
    m_beams[this->active_element]->EvaluateSectionPoint(eta, splinepoint);
    ////GetLog() << "active_element = " << active_element << "\n";
    ////GetLog() << "tau = " << tau << "\n";
    ////GetLog() << "u1 = " << u1 << "\n";
    ////GetLog() << "u2 = " << u2 << "\n";
    ////GetLog() << "eta = " << eta << "\n";
    ////GetLog() << "point = " << splinepoint << "\n";
    ChVector<> res = Arw.transpose() * (splinepoint - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVector<> cres = res * c;
    ////GetLog() << "res = " << res << "\n";
    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    ////GetLog() << "cres = " << cres << "\n";
    ////Qc(off_L + 0) += cres.x();
    ////Qc(off_L + 0) += cres.y();
    ////Qc(off_L + 1) += cres.z();
}